

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O0

CaseDefinition *
vkt::pipeline::anon_unknown_0::makeStructCompositeCaseDefinition
          (CaseDefinition *__return_storage_ptr__,DataType memberType)

{
  DataType type;
  int specValue_00;
  deUint32 dVar1;
  ostream *poVar2;
  char *pcVar3;
  GenericValue value_;
  FeatureFlags FVar4;
  DataType type_00;
  DataType local_4c8;
  OffsetValue local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  allocator<char> local_3f1;
  string local_3f0;
  SpecConstant local_3d0;
  undefined1 local_392;
  allocator<char> local_391;
  string local_390 [8];
  string caseName;
  ostringstream local_350 [8];
  ostringstream mainCode;
  allocator<char> local_1d1;
  undefined1 local_1d0 [8];
  string accumTypeStr;
  DataType accumType;
  int checksum;
  int specValue;
  bool isBoolData;
  DataType scalarType;
  ostringstream local_190 [8];
  ostringstream globalCode;
  DataType memberType_local;
  CaseDefinition *def;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"struct Data {\n");
  poVar2 = std::operator<<(poVar2,"    int   i;\n");
  poVar2 = std::operator<<(poVar2,"    float f;\n");
  poVar2 = std::operator<<(poVar2,"    bool  b;\n");
  poVar2 = std::operator<<(poVar2,"    ");
  pcVar3 = glu::getDataTypeName(memberType);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," sc;\n");
  poVar2 = std::operator<<(poVar2,"    uint  ui;\n");
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Data s0 = Data(3, 2.0, true, ");
  pcVar3 = glu::getDataTypeName(memberType);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"(sc0), 8u);\n");
  type = glu::getDataTypeScalarType(memberType);
  specValue_00 = 0x17;
  if (type == TYPE_BOOL) {
    specValue_00 = 0;
  }
  accumTypeStr.field_2._12_4_ = specValue_00 + 0xe;
  local_4c8 = type;
  if (type == TYPE_BOOL) {
    local_4c8 = TYPE_INT;
  }
  accumTypeStr.field_2._8_4_ = local_4c8;
  pcVar3 = glu::getDataTypeName(local_4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1d0,pcVar3,&local_1d1);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::ostringstream::ostringstream(local_350);
  poVar2 = std::operator<<((ostream *)local_350,"    ");
  poVar2 = std::operator<<(poVar2,(string *)local_1d0);
  poVar2 = std::operator<<(poVar2," sum_s0 = ");
  poVar2 = std::operator<<(poVar2,(string *)local_1d0);
  poVar2 = std::operator<<(poVar2,"(0);\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"    sum_s0 += ");
  poVar2 = std::operator<<(poVar2,(string *)local_1d0);
  poVar2 = std::operator<<(poVar2,"(s0.i);\n");
  poVar2 = std::operator<<(poVar2,"    sum_s0 += ");
  poVar2 = std::operator<<(poVar2,(string *)local_1d0);
  poVar2 = std::operator<<(poVar2,"(s0.f);\n");
  poVar2 = std::operator<<(poVar2,"    sum_s0 += ");
  poVar2 = std::operator<<(poVar2,(string *)local_1d0);
  poVar2 = std::operator<<(poVar2,"(s0.b);\n");
  poVar2 = std::operator<<(poVar2,"    sum_s0 += ");
  poVar2 = std::operator<<(poVar2,(string *)local_1d0);
  poVar2 = std::operator<<(poVar2,"(s0.sc");
  pipeline::(anonymous_namespace)::composite_case_internal::
  getFirstDataElementSubscriptString_abi_cxx11_
            ((string *)((long)&caseName.field_2 + 8),(composite_case_internal *)(ulong)memberType,
             type_00);
  poVar2 = std::operator<<(poVar2,(string *)(caseName.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,");\n");
  poVar2 = std::operator<<(poVar2,"    sum_s0 += ");
  poVar2 = std::operator<<(poVar2,(string *)local_1d0);
  poVar2 = std::operator<<(poVar2,"(s0.ui);\n");
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"    sb_out.result = sum_s0;\n");
  std::__cxx11::string::~string((string *)(caseName.field_2._M_local_buf + 8));
  pcVar3 = glu::getDataTypeName(memberType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_390,pcVar3,&local_391);
  std::allocator<char>::~allocator(&local_391);
  local_392 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"sc0",&local_3f1);
  composite_case_internal::makeSpecConstant(&local_3d0,&local_3f0,1,type,specValue_00);
  makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
            (&__return_storage_ptr__->specConstants,&local_3d0);
  dVar1 = composite_case_internal::getDataTypeScalarSizeBytes(accumTypeStr.field_2._8_4_);
  __return_storage_ptr__->ssboSize = (ulong)dVar1;
  std::operator+(&local_418,"    ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
  std::operator+(&__return_storage_ptr__->ssboCode,&local_418," result;\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  dVar1 = composite_case_internal::getDataTypeScalarSizeBytes(memberType);
  value_ = composite_case_internal::makeValue(type,accumTypeStr.field_2._12_4_);
  OffsetValue::OffsetValue(&local_428,dVar1,0,value_);
  makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
            (&__return_storage_ptr__->expectedValues,&local_428);
  FVar4 = 0;
  if (type == TYPE_DOUBLE) {
    FVar4 = 4;
  }
  __return_storage_ptr__->requirements = FVar4;
  std::__cxx11::string::~string((string *)&local_418);
  SpecConstant::~SpecConstant(&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  local_392 = 1;
  std::__cxx11::string::~string(local_390);
  std::__cxx11::ostringstream::~ostringstream(local_350);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

CaseDefinition makeStructCompositeCaseDefinition (const glu::DataType memberType)
{
	using namespace composite_case_internal;

	std::ostringstream globalCode;
	{
		globalCode << "struct Data {\n"
				   << "    int   i;\n"
				   << "    float f;\n"
				   << "    bool  b;\n"
				   << "    " << glu::getDataTypeName(memberType) << " sc;\n"
				   << "    uint  ui;\n"
				   << "};\n"
				   << "\n"
				   << "Data s0 = Data(3, 2.0, true, " << glu::getDataTypeName(memberType) << "(sc0), 8u);\n";
	}

	const glu::DataType scalarType   = glu::getDataTypeScalarType(memberType);
	const bool          isBoolData   = (scalarType == glu::TYPE_BOOL);
	const int           specValue    = (isBoolData ? 0 : 23);
	const int           checksum     = (3 + 2 + 1 + specValue + 8);  // matches the shader code
	const glu::DataType accumType    = (isBoolData ? glu::TYPE_INT : scalarType);
	const std::string   accumTypeStr = glu::getDataTypeName(accumType);

	std::ostringstream mainCode;
	{
		mainCode << "    " << accumTypeStr << " sum_s0 = " << accumTypeStr << "(0);\n"
				 << "\n"
				 << "    sum_s0 += " << accumTypeStr << "(s0.i);\n"
				 << "    sum_s0 += " << accumTypeStr << "(s0.f);\n"
				 << "    sum_s0 += " << accumTypeStr << "(s0.b);\n"
				 << "    sum_s0 += " << accumTypeStr << "(s0.sc" << getFirstDataElementSubscriptString(memberType) << ");\n"
				 << "    sum_s0 += " << accumTypeStr << "(s0.ui);\n"
				 << "\n"
				 << "    sb_out.result = sum_s0;\n";
	}

	const std::string caseName = glu::getDataTypeName(memberType);

	const CaseDefinition def =
	{
		caseName,
		makeVector(makeSpecConstant("sc0", 1u, scalarType, specValue)),
		getDataTypeScalarSizeBytes(accumType),
		"    " + accumTypeStr + " result;\n",
		globalCode.str(),
		mainCode.str(),
		makeVector(OffsetValue(getDataTypeScalarSizeBytes(memberType), 0, makeValue(scalarType, checksum))),
		(scalarType == glu::TYPE_DOUBLE ? (FeatureFlags)FEATURE_SHADER_FLOAT_64 : (FeatureFlags)0),
	};
	return def;
}